

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.h
# Opt level: O2

void __thiscall crnlib::etc1_block::set_selector(etc1_block *this,uint x,uint y,uint val)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  
  uVar3 = y + x * 4;
  bVar2 = (byte)uVar3 & 7;
  uVar4 = (ulong)(7 - (uVar3 >> 3));
  bVar1 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)val);
  bVar5 = ~(byte)(1 << bVar2);
  this->m_low_color[uVar4 - 8] = (byte)((bVar1 & 1) << bVar2) | this->m_low_color[uVar4 - 8] & bVar5
  ;
  this->m_low_color[uVar4 - 10] = (bVar1 >> 1) << bVar2 | bVar5 & this->m_low_color[uVar4 - 10];
  return;
}

Assistant:

inline void set_selector(uint x, uint y, uint val)
        {
            CRNLIB_ASSERT((x | y | val) < 4);
            const uint bit_index = x * 4 + y;

            uint8* p = &m_bytes[7 - (bit_index >> 3)];

            const uint byte_bit_ofs = bit_index & 7;
            const uint mask = 1 << byte_bit_ofs;

            const uint etc1_val = g_selector_index_to_etc1[val];

            const uint lsb = etc1_val & 1;
            const uint msb = etc1_val >> 1;

            p[0] &= ~mask;
            p[0] |= (lsb << byte_bit_ofs);

            p[-2] &= ~mask;
            p[-2] |= (msb << byte_bit_ofs);
        }